

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
llbuild::buildsystem::BuildSystemDelegate::~BuildSystemDelegate(BuildSystemDelegate *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

BuildSystemDelegate::~BuildSystemDelegate() {}